

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O3

sexp load_image_callback_p2(sexp ctx,sexp dstp,void *user)

{
  sexp_proc1 p_Var1;
  sexp_proc2 p_Var2;
  sexp psVar3;
  
  psVar3 = (sexp)&DAT_0000013e;
  if (((ulong)dstp & 3) == 0) {
    if (dstp->tag == 1) {
      if ((dstp->value).type.finalize == (sexp_proc2)0x0) {
        return (sexp)&DAT_0000013e;
      }
      psVar3 = (dstp->value).type.finalize_name;
      if (psVar3 == (sexp)0x0) {
        builtin_strncpy(gc_heap_err_str + 0x20,"tion name",10);
        builtin_strncpy(gc_heap_err_str + 0x10,"eld missing func",0x10);
        builtin_strncpy(gc_heap_err_str,"type finalize fi",0x10);
      }
      else {
        p_Var2 = (sexp_proc2)load_image_fn(ctx,(dstp->value).type.dl,(psVar3->value).type.name);
        if (p_Var2 != (sexp_proc2)0x0) {
          (dstp->value).type.finalize = p_Var2;
          return (sexp)&DAT_0000013e;
        }
      }
    }
    else {
      if (dstp->tag != 0x1b) {
        return (sexp)&DAT_0000013e;
      }
      if ((dstp->value).opcode.func == (sexp_proc1)0x0) {
        return (sexp)&DAT_0000013e;
      }
      psVar3 = (dstp->value).type.slots;
      if (((((ulong)psVar3 & 3) == 0 && psVar3 != (sexp)0x0) && (psVar3->tag == 9)) ||
         (psVar3 = (dstp->value).type.name, psVar3 != (sexp)0x0)) {
        p_Var1 = (sexp_proc1)load_image_fn(ctx,(dstp->value).opcode.dl,(psVar3->value).type.name);
        if (p_Var1 != (sexp_proc1)0x0) {
          (dstp->value).opcode.func = p_Var1;
          return (sexp)&DAT_0000013e;
        }
      }
      else {
        builtin_strncpy(gc_heap_err_str,"opcode func field missing function name",0x28);
      }
    }
    psVar3 = (sexp)&DAT_0000003e;
  }
  return psVar3;
}

Assistant:

static sexp load_image_callback_p2 (sexp ctx, sexp dstp, void *user) {
  sexp res = NULL;
  sexp name = NULL;
  void *fn = NULL;

  if (sexp_opcodep(dstp) && sexp_opcode_func(dstp)) {
    if (sexp_opcode_data2(dstp) && sexp_stringp(sexp_opcode_data2(dstp))) {
      name = sexp_opcode_data2(dstp);
    } else {
      name = sexp_opcode_name(dstp);
    }
    if (!name) {
      snprintf(gc_heap_err_str, ERR_STR_SIZE, "opcode func field missing function name");
      return SEXP_FALSE;
    }
    
    fn = load_image_fn(ctx, sexp_opcode_dl(dstp), name);
    if (!fn) {
      return SEXP_FALSE;
    }
    sexp_opcode_func(dstp) = fn;
  
  } else if (sexp_typep(dstp) && sexp_type_finalize(dstp)) {
    name = sexp_type_finalize_name(dstp);
    if (!name) {
      snprintf(gc_heap_err_str, ERR_STR_SIZE, "type finalize field missing function name");
      return SEXP_FALSE;
    }
    fn = load_image_fn(ctx, sexp_type_dl(dstp), name);
    if (!fn) {
      return SEXP_FALSE;
    }
    sexp_type_finalize(dstp) = fn;
  }
  res = SEXP_TRUE;
  return res;
}